

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

dtime_t __thiscall duckdb::StrpTimeFormat::ParseResult::ToTime(ParseResult *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  dtime_t dVar3;
  short sVar4;
  uint uVar5;
  short sVar6;
  int iVar7;
  
  iVar1 = this->data[7];
  iVar7 = (int)((ulong)((long)iVar1 * 0x6e5d4c3b) >> 0x20) - iVar1;
  sVar4 = (short)(iVar1 % 0xe10);
  uVar5 = ((uint)(sVar4 * -0x7777) >> 0x10) + iVar1 % 0xe10;
  sVar6 = ((short)uVar5 >> 5) + (short)((uVar5 & 0xffff) >> 0xf);
  auVar2 = SEXT816((long)this->data[6] + 500) * SEXT816(0x20c49ba5e353f7cf);
  dVar3 = Time::FromTime(((iVar7 >> 0xb) - (iVar7 >> 0x1f)) + this->data[3],
                         this->data[4] - (int)sVar6,
                         this->data[5] - (int)(short)(sVar4 + sVar6 * -0x3c),
                         (int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f));
  return (dtime_t)dVar3.micros;
}

Assistant:

dtime_t StrpTimeFormat::ParseResult::ToTime() {
	int hh, mm, ss;
	StrfTimeSplitOffset(data[7], hh, mm, ss);
	return Time::FromTime(data[3] - hh, data[4] - mm, data[5] - ss, GetMicros());
}